

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::RAInstBuilder::addCallRet(RAInstBuilder *this,RAWorkReg *workReg,uint32_t outId)

{
  RABlock **item;
  int iVar1;
  undefined4 *puVar2;
  Logger *this_00;
  FuncNode *pFVar3;
  RABlock *pRVar4;
  RABlock *this_01;
  BaseRAPass *pBVar5;
  InstControlFlow IVar6;
  Error EVar7;
  Error EVar8;
  Error EVar9;
  RABlock *pRVar10;
  undefined8 extraout_RAX;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  Error EVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  uint uVar18;
  InvokeNode *initialNode;
  char cVar19;
  InvokeNode *pIVar20;
  bool bVar21;
  bool bVar22;
  char cVar23;
  float __x;
  InstControlFlow IStack_10bc;
  Error EStack_10b8;
  undefined4 uStack_10b4;
  uint64_t uStack_10b0;
  long lStack_10a8;
  long lStack_10a0;
  RABlock *pRStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined4 uStack_1078;
  undefined8 uStack_1074;
  undefined8 uStack_106c;
  undefined8 uStack_1064;
  undefined8 uStack_105c;
  undefined4 uStack_1054;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  uint *puStack_1040;
  uint auStack_1038 [3];
  byte abStack_102a [4082];
  
  if (outId == 0xff) {
    addCallRet();
LAB_0013a6d9:
    addCallRet();
  }
  else {
    uVar15 = *(uint *)(workReg + 0x20);
    uVar16 = uVar15 >> 8 & 0xf;
    bVar11 = (byte)outId;
    uVar18 = 1 << (bVar11 & 0x1f);
    *(uint *)(this + 8) = *(uint *)(this + 8) | 0x8a;
    if (3 < (byte)uVar16) goto LAB_0013a6d9;
    *(uint *)(this + (ulong)uVar16 * 4 + 0x18) = *(uint *)(this + (ulong)uVar16 * 4 + 0x18) | uVar18
    ;
    *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 0x101 << ((byte)(uVar15 >> 8) & 0xf);
    lVar13 = *(long *)(workReg + 0x10);
    if (lVar13 != 0) {
      if (*(char *)(lVar13 + 0xf) == -1) {
        *(char *)(lVar13 + 0xc) = *(char *)(lVar13 + 0xc) + '\x01';
        *(byte *)(lVar13 + 8) = *(byte *)(lVar13 + 8) | 0x8a;
        *(byte *)(lVar13 + 0xf) = bVar11;
        return 0;
      }
      return 0x41;
    }
    puVar2 = *(undefined4 **)(this + 0x38);
    if (((long)puVar2 + (-0x40 - (long)this) & 0x1ffffff000U) == 0) {
      *(undefined4 **)(this + 0x38) = puVar2 + 8;
      *puVar2 = *(undefined4 *)workReg;
      *(undefined8 *)(puVar2 + 1) = 0x8affffffff;
      *(undefined2 *)(puVar2 + 3) = 1;
      *(undefined1 *)((long)puVar2 + 0xe) = 0xff;
      *(byte *)((long)puVar2 + 0xf) = bVar11;
      puVar2[4] = 0xffffffff;
      puVar2[5] = uVar18;
      *(undefined8 *)(puVar2 + 6) = 0;
      *(undefined4 **)(workReg + 0x10) = puVar2;
      *(undefined4 *)(workReg + 0x28) = *(undefined4 *)this;
      if (this[(ulong)uVar16 + 0x10] != (RAInstBuilder)0xff) {
        *(int *)(this + 0x10) = *(int *)(this + 0x10) + (1 << ((byte)uVar16 * '\b' & 0x1f));
        return 0;
      }
      goto LAB_0013a6e3;
    }
  }
  addCallRet();
LAB_0013a6e3:
  addCallRet();
  this_00 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger;
  if (this_00 != (Logger *)0x0) {
    Logger::logf(this_00,__x);
  }
  EVar7 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
                    ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this);
  if (EVar7 == 0) {
    if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
        (Logger *)0x0) {
      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                 (BaseNode *)
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _funcNode,2,(char *)0x0);
    }
    if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
        (Logger *)0x0) {
      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _curBlock,2);
    }
    pFVar3 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
             _funcNode;
    pIVar20 = *(InvokeNode **)&pFVar3->field_0x8;
    if (pIVar20 == (InvokeNode *)0x0) {
LAB_0013b136:
      EVar7 = 3;
    }
    else {
      item = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _curBlock;
      pRStack_1098 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock;
      *(FuncNode **)(pRStack_1098 + 0x10) = pFVar3;
      *(FuncNode **)(pRStack_1098 + 0x18) = pFVar3;
      uStack_1078 = 0xffffffff;
      uStack_1074 = 0;
      uStack_106c = 0;
      uStack_1064 = 0;
      uStack_105c = 0;
      uStack_1054 = 0;
      uStack_1050 = 0;
      uStack_1048 = 0;
      puStack_1040 = auStack_1038;
      uStack_1090 = 0;
      uStack_1088 = 0;
      EVar8 = EVar7;
      do {
        iVar1 = *(int *)&pIVar20->field_0x14;
        if (1 < iVar1 + 1U) {
LAB_0013b10f:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&pIVar20->field_0x8;
        EVar9 = EVar7;
        if ((pIVar20->field_0x11 & 0x20) != 0) {
          if (*item == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::removeNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar20);
            cVar23 = '\x05';
            pIVar20 = initialNode;
            goto LAB_0013aba9;
          }
          (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._hasCode =
               true;
          if ((byte)(pIVar20->field_0x10 - 0x11) < 2) {
            if (iVar1 == -1) {
              *(undefined4 *)&pIVar20->field_0x14 = 0;
            }
            else {
              lVar13 = *(long *)pIVar20;
              if ((pIVar20->field_0x10 == '\x12') &&
                 (EVar9 = a64::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,pIVar20),
                 EVar8 = EVar7, EVar9 != 0)) {
                bVar22 = false;
                EVar7 = EVar9;
                EVar8 = EVar9;
              }
              else {
                if (lVar13 != *(long *)pIVar20) {
                  if (*(InvokeNode **)(*item + 0x10) == pIVar20) {
                    *(undefined8 *)(*item + 0x10) = *(undefined8 *)(lVar13 + 8);
                  }
                  *(undefined4 *)&pIVar20->field_0x14 = 0xffffffff;
                  pIVar20 = *(InvokeNode **)(lVar13 + 8);
                  if ((pIVar20->field_0x11 & 0x20) == 0) {
LAB_0013b12c:
                    RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                    goto LAB_0013b131;
                  }
                }
                initialNode = *(InvokeNode **)&pIVar20->field_0x8;
                bVar22 = true;
              }
              cVar23 = '\x01';
              EVar9 = EVar7;
              if (!bVar22) goto LAB_0013aba9;
            }
          }
          if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar20,4
                       ,(char *)0x0);
          }
          IStack_10bc = kRegular;
          uStack_1078 = *(undefined4 *)
                         ((((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 8);
          uStack_1054 = 0;
          uStack_1064 = 0;
          uStack_105c = 0;
          uStack_1074 = 0;
          uStack_106c = 0;
          uStack_1050 = 0;
          uStack_1048 = 0;
          puStack_1040 = auStack_1038;
          EVar7 = a64::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,(InstNode *)pIVar20,&IStack_10bc,
                             (RAInstBuilder *)&uStack_1078);
          cVar19 = '\x01';
          cVar23 = cVar19;
          if ((EVar7 == 0) &&
             ((pIVar20->field_0x10 != '\x12' ||
              (EVar7 = a64::RACFGBuilder::onInvoke
                                 ((RACFGBuilder *)this,pIVar20,(RAInstBuilder *)&uStack_1078),
              EVar7 == 0)))) {
            if (pIVar20->field_0x10 == '\x11') {
              EVar7 = a64::RACFGBuilder::onRet
                                ((RACFGBuilder *)this,(FuncRetNode *)pIVar20,
                                 (RAInstBuilder *)&uStack_1078);
              if (EVar7 != 0) goto LAB_0013aa3c;
              IStack_10bc = kMaxValue;
            }
            if ((IStack_10bc == kJump) && (auStack_1038 != puStack_1040)) {
              pBVar5 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
              pRVar10 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              uVar15 = 0;
              puVar17 = auStack_1038;
              do {
                if (*(uint *)&pBVar5->field_0x148 <= *puVar17) {
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  goto LAB_0013b10f;
                }
                if ((*(byte *)(*(long *)(*(long *)&pBVar5->_workRegs + (ulong)*puVar17 * 8) + 0x21)
                    & 0xf) == 0) {
                  bVar11 = *(byte *)((long)puVar17 + 0xe);
                  if (bVar11 == 0xff) {
                    if (1 < uVar15) {
                      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                      goto LAB_0013b12c;
                    }
                    uVar12 = (ulong)uVar15;
                    uVar15 = uVar15 + 1;
                    bVar11 = (pBVar5->_scratchRegIndexes)._data[uVar12];
                    *(byte *)((long)puVar17 + 0xe) = bVar11;
                  }
                  pRVar4 = pRVar10 + 0xc0;
                  *(uint *)pRVar4 = *(uint *)pRVar4 | 1 << (bVar11 & 0x1f);
                }
                puVar17 = puVar17 + 8;
              } while (puVar17 != puStack_1040);
            }
            EVar7 = BaseRAPass::assignRAInst
                              ((((RACFGBuilder *)this)->
                               super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                               (BaseNode *)pIVar20,
                               (((RACFGBuilder *)this)->
                               super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock,
                               (RAInstBuilder *)&uStack_1078);
            IVar6 = IStack_10bc;
            if (EVar7 == 0) {
              uVar15 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._blockRegStats._packed
                       | (uint)uStack_1064;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _blockRegStats._packed = uVar15;
              if (IStack_10bc != kRegular) {
                if (IStack_10bc < kCall) {
                  pRVar10 = *item;
                  *(InvokeNode **)(pRVar10 + 0x18) = pIVar20;
                  uVar16 = *(uint *)(pRVar10 + 0xc);
                  *(uint *)(pRVar10 + 0xc) = uVar16 | 0x101;
                  *(uint *)(pRVar10 + 0x30) = *(uint *)(pRVar10 + 0x30) | uVar15;
                  if ((pIVar20->field_0x34 & 2) == 0) {
                    if (pIVar20->field_0x12 == 0) {
                      cVar23 = '\x01';
                      EVar8 = 3;
                    }
                    else {
                      lVar13 = (ulong)((byte)pIVar20->field_0x12 - 1) * 0x10;
                      if ((*(uint *)(&pIVar20->field_0x40 + lVar13) & 7) == 5) {
                        EVar7 = BaseBuilder::labelNodeOf
                                          (&((((RACFGBuilder *)this)->
                                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                            _cc)->super_BaseBuilder,(LabelNode **)&EStack_10b8,
                                           *(uint32_t *)(&pIVar20->field_0x44 + lVar13));
                        if (EVar7 == 0) {
                          bVar22 = false;
                          pRVar10 = BaseRAPass::newBlockOrExistingAt
                                              ((((RACFGBuilder *)this)->
                                               super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                               )._pass,(LabelNode *)
                                                       CONCAT44(uStack_10b4,EStack_10b8),
                                               (BaseNode **)0x0);
                          if (pRVar10 == (RABlock *)0x0) {
                            EVar7 = 1;
                          }
                          else {
                            pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                            EVar9 = RABlock::appendSuccessor(*item,pRVar10);
                            bVar22 = EVar9 == 0;
                            EVar7 = EVar8;
                            if (!bVar22) {
                              EVar7 = EVar9;
                            }
                          }
                        }
                        else {
                          bVar22 = false;
                        }
                        cVar23 = '\x01';
                        EVar8 = EVar7;
                        if (bVar22) {
LAB_0013af05:
                          cVar23 = '\0';
                          EVar8 = EVar7;
                        }
                      }
                      else {
                        *(uint *)(pRVar10 + 0xc) = uVar16 | 0x501;
                        if (pIVar20->field_0x10 == '\x0f') {
                          lVar13 = *(long *)&pIVar20->_funcDetail;
                        }
                        else {
                          lVar13 = 0;
                        }
                        pBVar5 = (((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
                        if (lVar13 == 0) {
                          EVar7 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                            ((ZoneVector<asmjit::v1_14::RABlock_*> *)&uStack_1090,
                                             &pBVar5->_allocator,item);
                          cVar23 = '\x01';
                          if (EVar7 == 0) goto LAB_0013aeff;
                        }
                        else {
                          uStack_10b0 = pBVar5->_lastTimestamp + 1;
                          pBVar5->_lastTimestamp = uStack_10b0;
                          bVar22 = (ulong)*(uint *)(lVar13 + 0x18) == 0;
                          if (!bVar22) {
                            lStack_10a0 = *(long *)(lVar13 + 0x10);
                            lStack_10a8 = (ulong)*(uint *)(lVar13 + 0x18) << 2;
                            lVar13 = 0;
                            do {
                              EVar7 = BaseBuilder::labelNodeOf
                                                (&((((RACFGBuilder *)this)->
                                                                                                      
                                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                                  )._cc)->super_BaseBuilder,
                                                 (LabelNode **)&EStack_10b8,
                                                 *(uint32_t *)(lStack_10a0 + lVar13));
                              if (EVar7 == 0) {
                                pRVar10 = BaseRAPass::newBlockOrExistingAt
                                                    ((((RACFGBuilder *)this)->
                                                                                                          
                                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                                  )._pass,(LabelNode *)
                                                          CONCAT44(uStack_10b4,EStack_10b8),
                                                  (BaseNode **)0x0);
                                if (pRVar10 == (RABlock *)0x0) {
                                  EVar7 = 1;
                                  goto LAB_0013ade1;
                                }
                                bVar21 = true;
                                if (*(uint64_t *)(pRVar10 + 0x48) != uStack_10b0) {
                                  *(uint64_t *)(pRVar10 + 0x48) = uStack_10b0;
                                  pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                                  EVar7 = RABlock::appendSuccessor(*item,pRVar10);
                                  bVar21 = EVar7 == 0;
                                  if (!bVar21) {
                                    EVar8 = EVar7;
                                  }
                                }
                              }
                              else {
LAB_0013ade1:
                                bVar21 = false;
                                EVar8 = EVar7;
                              }
                              if (!bVar21) {
                                cVar23 = '\x01';
                                goto LAB_0013aeda;
                              }
                              lVar13 = lVar13 + 4;
                              bVar22 = lStack_10a8 == lVar13;
                            } while (!bVar22);
                          }
                          cVar23 = '\x1c';
LAB_0013aeda:
                          EVar7 = EVar8;
                          if (bVar22) {
                            EVar8 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::
                                    shareAssignmentAcrossSuccessors
                                              ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)
                                               this,(((RACFGBuilder *)this)->
                                                                                                        
                                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                                  )._curBlock);
                            cVar23 = EVar8 != 0;
                            if ((bool)cVar23) {
                              EVar7 = EVar8;
                            }
                          }
                          EVar8 = EVar7;
                          if (cVar23 == '\0') {
LAB_0013aeff:
                            EVar7 = EVar8;
                            cVar23 = '\0';
                          }
                        }
                        EVar8 = EVar7;
                        if (cVar23 == '\0') goto LAB_0013af05;
                      }
                    }
                    EVar7 = EVar8;
                    if (cVar23 != '\0') goto LAB_0013aa3c;
                  }
                  if (IVar6 != kJump) {
                    pIVar20 = initialNode;
                    if (initialNode == (InvokeNode *)0x0) {
                      EVar7 = 3;
                      cVar23 = cVar19;
                      goto LAB_0013aa3c;
                    }
                    if (initialNode->field_0x10 == '\x03') {
                      pRVar10 = *(RABlock **)&initialNode->field_0x20;
                      if (pRVar10 == (RABlock *)0x0) {
                        pRVar10 = BaseRAPass::newBlock
                                            ((((RACFGBuilder *)this)->
                                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                             _pass,(BaseNode *)initialNode);
                        if (pRVar10 == (RABlock *)0x0) goto LAB_0013b0a3;
                        *(RABlock **)&initialNode->field_0x20 = pRVar10;
                      }
                    }
                    else {
                      pRVar10 = BaseRAPass::newBlock
                                          ((((RACFGBuilder *)this)->
                                           super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                           _pass,(BaseNode *)initialNode);
                      if (pRVar10 == (RABlock *)0x0) {
LAB_0013b0a3:
                        EVar7 = 1;
                        cVar23 = '\x01';
                        goto LAB_0013aa3c;
                      }
                    }
                    this_01 = *item;
                    pRVar4 = this_01 + 0xc;
                    *(uint *)pRVar4 = *(uint *)pRVar4 | 0x200;
                    EVar7 = RABlock::prependSuccessor(this_01,pRVar10);
                    cVar23 = cVar19;
                    if (EVar7 == 0) {
                      (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._curBlock = pRVar10;
                      (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._hasCode = false;
                      (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._blockRegStats._packed = 0;
                      if (((byte)pRVar10[0xc] & 1) == 0) {
                        EVar7 = BaseRAPass::addBlock
                                          ((((RACFGBuilder *)this)->
                                           super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                           _pass,pRVar10);
                        if ((EVar7 == 0) &&
                           (EVar7 = EVar8, cVar23 = '\x05',
                           (((RACFGBuilder *)this)->
                           super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
                           (Logger *)0x0)) {
                          RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                                    ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                                     (((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                     _curBlock,2);
                        }
                      }
                      else {
                        EVar7 = EVar8;
                        cVar23 = '\x04';
                      }
                    }
                    goto LAB_0013aa3c;
                  }
                  *item = (RABlock *)0x0;
                }
                if (IVar6 == kMaxValue) {
                  pRVar10 = (((RACFGBuilder *)this)->
                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
                  *(InvokeNode **)(pRVar10 + 0x18) = pIVar20;
                  pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 1);
                  *(uint *)(pRVar10 + 0x30) =
                       *(uint *)(pRVar10 + 0x30) |
                       (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._blockRegStats._packed
                  ;
                  EVar7 = RABlock::appendSuccessor
                                    (pRVar10,(((RACFGBuilder *)this)->
                                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                             _retBlock);
                  cVar23 = cVar19;
                  if (EVar7 != 0) goto LAB_0013aa3c;
                  *item = (RABlock *)0x0;
                }
              }
              EVar7 = EVar8;
              cVar23 = '\0';
            }
          }
LAB_0013aa3c:
          EVar9 = EVar7;
          EVar8 = EVar7;
          if (cVar23 != '\0') goto LAB_0013aba9;
          goto LAB_0013ab9a;
        }
        if (pIVar20->field_0x10 == '\x03') {
          pRVar10 = *item;
          pRVar4 = *(RABlock **)&pIVar20->field_0x20;
          if (pRVar10 != (RABlock *)0x0) {
            if (pRVar4 == (RABlock *)0x0) {
              if ((pRVar10 == pRStack_1098 |
                  (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _hasCode) == 1) {
                if (*(InvokeNode **)(pRVar10 + 0x18) == pIVar20) {
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                *(undefined8 *)(pRVar10 + 0x18) = *(undefined8 *)pIVar20;
                *(uint *)(pRVar10 + 0xc) = *(uint *)(pRVar10 + 0xc) | 0x201;
                *(uint *)(pRVar10 + 0x30) =
                     *(uint *)(pRVar10 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                pRVar10 = BaseRAPass::newBlock
                                    ((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                     (BaseNode *)pIVar20);
                cVar23 = '\x01';
                if (pRVar10 == (RABlock *)0x0) {
                  bVar22 = false;
                  EVar7 = 1;
                }
                else {
                  pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                  EVar8 = RABlock::appendSuccessor(*item,pRVar10);
                  if ((EVar8 == 0) &&
                     (EVar8 = BaseRAPass::addBlock
                                        ((((RACFGBuilder *)this)->
                                         super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                         _pass,pRVar10), EVar8 == 0)) {
                    (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _curBlock = pRVar10;
                    (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _hasCode = false;
                    (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _blockRegStats._packed = 0;
                    bVar22 = true;
                  }
                  else {
                    bVar22 = false;
                    EVar7 = EVar8;
                  }
                }
                EVar9 = EVar7;
                EVar8 = EVar7;
                if (!bVar22) goto LAB_0013aba9;
              }
              *(RABlock **)&pIVar20->field_0x20 = *item;
              EVar14 = EVar8;
            }
            else {
              pRVar4[0xc] = (RABlock)((byte)pRVar4[0xc] | 4);
              if (pRVar10 == pRVar4) {
                bVar22 = true;
                if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _hasCode == true) {
                  EVar8 = 3;
LAB_0013a84f:
                  EVar7 = EVar8;
                  bVar22 = false;
                  EVar8 = EVar7;
                }
              }
              else {
                if (*(InvokeNode **)(pRVar10 + 0x18) == pIVar20) {
LAB_0013b131:
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  goto LAB_0013b136;
                }
                *(undefined8 *)(pRVar10 + 0x18) = *(undefined8 *)pIVar20;
                *(uint *)(pRVar10 + 0xc) = *(uint *)(pRVar10 + 0xc) | 0x201;
                *(uint *)(pRVar10 + 0x30) =
                     *(uint *)(pRVar10 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                EVar8 = RABlock::appendSuccessor(pRVar10,pRVar4);
                if ((EVar8 != 0) ||
                   (EVar8 = BaseRAPass::addBlock
                                      ((((RACFGBuilder *)this)->
                                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                       pRVar4), EVar8 != 0)) goto LAB_0013a84f;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar4;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _hasCode = false;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _blockRegStats._packed = 0;
                bVar22 = true;
                EVar8 = EVar7;
              }
              cVar23 = '\x01';
              EVar9 = EVar7;
              EVar14 = EVar8;
              if (!bVar22) goto LAB_0013aba9;
            }
LAB_0013ab51:
            pRVar10 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._curBlock;
            if (((pRVar10 != (RABlock *)0x0) &&
                (pRVar10 !=
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _lastLoggedBlock)) &&
               ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0)) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,pRVar10,2);
            }
            if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar20
                         ,2,(char *)0x0);
            }
            EVar8 = EVar14;
            if (*(uint32_t *)&pIVar20->field_0x30 ==
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _exitLabelId) {
              pRVar10 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              *(InvokeNode **)(pRVar10 + 0x18) = pIVar20;
              pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 1);
              *(uint *)(pRVar10 + 0x30) =
                   *(uint *)(pRVar10 + 0x30) |
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _blockRegStats._packed;
              EVar8 = BaseRAPass::addExitBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                 pRVar10);
              cVar23 = '\x01';
              EVar9 = EVar8;
              if (EVar8 != 0) goto LAB_0013aba9;
              *item = (RABlock *)0x0;
              EVar8 = EVar7;
            }
            goto LAB_0013ab9a;
          }
          *item = pRVar4;
          if (pRVar4 == (RABlock *)0x0) {
            pRVar10 = BaseRAPass::newBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                 (BaseNode *)pIVar20);
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _curBlock = pRVar10;
            if (pRVar10 != (RABlock *)0x0) {
              *(RABlock **)&pIVar20->field_0x20 = pRVar10;
              goto LAB_0013ab1a;
            }
            cVar23 = '\x01';
            EVar9 = 1;
            EVar8 = 1;
          }
          else {
            cVar23 = '\x04';
            if (((byte)pRVar4[0xc] & 1) == 0) {
LAB_0013ab1a:
              pRVar4 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              pRVar10 = pRVar4 + 0xc;
              *(uint *)pRVar10 = *(uint *)pRVar10 | 4;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _hasCode = false;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _blockRegStats._packed = 0;
              EVar8 = BaseRAPass::addBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,pRVar4
                                );
              cVar23 = '\x01';
              EVar9 = EVar8;
              EVar14 = EVar7;
              if (EVar8 == 0) goto LAB_0013ab51;
            }
          }
        }
        else {
          if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar20,4
                       ,(char *)0x0);
          }
          if (pIVar20->field_0x10 == '\n') {
            if (pIVar20 ==
                (InvokeNode *)
                ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _funcNode)->_end) {
              cVar23 = '\x04';
              if (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _curBlock == (RABlock *)0x0) ||
                 (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _hasCode & 1U) == 0)) goto LAB_0013aba9;
LAB_0013a904:
              cVar23 = '\x01';
              EVar9 = 3;
              EVar8 = 3;
              goto LAB_0013aba9;
            }
          }
          else if ((pIVar20->field_0x10 == '\x10') &&
                  (pIVar20 !=
                   (InvokeNode *)
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _funcNode)) goto LAB_0013a904;
LAB_0013ab9a:
          cVar23 = '\0';
          pIVar20 = initialNode;
          EVar9 = EVar7;
          if (initialNode == (InvokeNode *)0x0) {
            EVar8 = 3;
            cVar23 = '\x01';
            EVar9 = 3;
          }
        }
LAB_0013aba9:
        EVar7 = EVar9;
      } while ((cVar23 == '\0') || (cVar23 == '\x05'));
      if ((cVar23 == '\x04') &&
         (pBVar5 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _pass, EVar7 = 3, pBVar5->_createdBlockCount == *(uint32_t *)&pBVar5->field_0xb8)
         ) {
        RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
        EVar7 = EStack_10b8;
      }
    }
  }
  return EVar7;
}

Assistant:

Error addCallRet(RAWorkReg* workReg, uint32_t outId) noexcept {
    ASMJIT_ASSERT(outId != BaseReg::kIdBad);

    RATiedFlags flags = RATiedFlags::kOut | RATiedFlags::kWrite | RATiedFlags::kOutFixed;
    RegGroup group = workReg->group();
    RegMask outRegs = Support::bitMask(outId);

    _aggregatedFlags |= flags;
    _used[group] |= outRegs;
    _stats.makeFixed(group);
    _stats.makeUsed(group);

    RATiedReg* tiedReg = workReg->tiedReg();
    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, Support::allOnes<RegMask>(), BaseReg::kIdBad, 0, outRegs, outId, 0);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (tiedReg->hasOutId())
        return DebugUtils::errored(kErrorOverlappedRegs);

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->setOutId(outId);
      return kErrorOk;
    }
  }